

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCallback.cpp
# Opt level: O3

void __thiscall MyEmitter::emitMySignal3(MyEmitter *this)

{
  char *local_28;
  undefined8 local_20;
  long local_10;
  
  local_10 = 0;
  local_28 = "test";
  local_20 = 4;
  Callback::Emitter::emit<MyEmitter,String_const&>(&this->super_Emitter,0x29,(String *)0x0);
  if (local_10 != 0) {
    LOCK();
    local_10 = local_10 + -1;
    UNLOCK();
    if ((local_10 == 0) && (&local_28 != (char **)0x0)) {
      operator_delete__(&local_28);
    }
  }
  return;
}

Assistant:

void emitMySignal3()
  {
    emit<MyEmitter, const String&>(&MyEmitter::mySignal3, "test");
  }